

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::torrent::add_hashes
          (torrent *this,hash_request *req,span<libtorrent::digest32<256L>_> hashes)

{
  piece_index_t index;
  pointer req_00;
  bool bVar1;
  pointer this_00;
  pointer *this_01;
  reference psVar2;
  torrent_info *ptVar3;
  info_hash_t *piVar4;
  pointer ppVar5;
  const_iterator cStack_e8;
  piece_index_t p_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *__range2_1;
  piece_index_t local_b8;
  int local_b4;
  undefined4 local_b0;
  int local_ac;
  int local_a8;
  reference local_98;
  pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>
  *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
  *__range2;
  undefined1 local_68 [8];
  add_hashes_result result;
  hash_request *req_local;
  torrent *this_local;
  span<libtorrent::digest32<256L>_> hashes_local;
  
  hashes_local.m_ptr = (digest32<256L> *)hashes.m_len;
  this_local = (torrent *)hashes.m_ptr;
  result.hash_passed.
  super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)req;
  need_hash_picker(this);
  bVar1 = ::std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr *)&(this->super_torrent_hot_members).m_hash_picker);
  if (bVar1) {
    this_00 = ::std::
              unique_ptr<libtorrent::aux::hash_picker,_std::default_delete<libtorrent::aux::hash_picker>_>
              ::operator->(&(this->super_torrent_hot_members).m_hash_picker);
    req_00 = result.hash_passed.
             super__Vector_base<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    span<libtorrent::digest32<256l>const>::
    span<libtorrent::span<libtorrent::digest32<256l>>,libtorrent::digest32<256l>,void>
              ((span<libtorrent::digest32<256l>const> *)&__range2,
               (span<libtorrent::digest32<256L>_> *)&this_local);
    hash_picker::add_hashes((add_hashes_result *)local_68,this_00,(hash_request *)req_00,___range2);
    __end2 = ::std::
             vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
             ::begin((vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      *)&result);
    p = (pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>
         *)::std::
           vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::end((vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
                  *)&result);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
                                       *)&p), bVar1) {
      local_98 = __gnu_cxx::
                 __normal_iterator<const_std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
                 ::operator*(&__end2);
      ptVar3 = torrent_file(this);
      piVar4 = torrent_info::info_hashes(ptVar3);
      bVar1 = info_hash_t::has_v1(piVar4);
      if (bVar1) {
        local_a8 = (local_98->first).m_val;
        bVar1 = have_piece(this,(piece_index_t)local_a8);
        if (bVar1) {
          local_ac = (local_98->first).m_val;
          handle_inconsistent_hashes(this,(piece_index_t)local_ac);
          hashes_local.m_len._7_1_ = local_68[0] & 1;
          goto LAB_0068bf97;
        }
      }
      bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)&this->super_torrent_hot_members);
      if (bVar1) {
        ppVar5 = ::std::
                 unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ::operator->(&(this->super_torrent_hot_members).m_picker);
        local_b4 = (local_98->first).m_val;
        bVar1 = piece_picker::is_downloading(ppVar5,(piece_index_t)local_b4);
        if (bVar1) {
          local_b8.m_val = (local_98->first).m_val;
          ::std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)&__range2_1,&local_98->second);
          piece_failed(this,local_b8,(vector<int,_std::allocator<int>_> *)&__range2_1);
          ::std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)&__range2_1);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_*,_std::vector<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>_>
      ::operator++(&__end2);
    }
    this_01 = &result.hash_failed.
               super__Vector_base<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<int,_std::allocator<int>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    __end2_1 = ::std::
               vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
               ::begin((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                        *)this_01);
    cStack_e8 = ::std::
                vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                ::end((vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                       *)this_01);
    while (bVar1 = __gnu_cxx::operator!=(&__end2_1,&stack0xffffffffffffff18), bVar1) {
      psVar2 = __gnu_cxx::
               __normal_iterator<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
               ::operator*(&__end2_1);
      index.m_val = psVar2->m_val;
      ptVar3 = torrent_file(this);
      piVar4 = torrent_info::info_hashes(ptVar3);
      bVar1 = info_hash_t::has_v1(piVar4);
      if ((bVar1) && (bVar1 = have_piece(this,index), !bVar1)) {
        handle_inconsistent_hashes(this,index);
        hashes_local.m_len._7_1_ = local_68[0] & 1;
        goto LAB_0068bf97;
      }
      bVar1 = ::std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr *)&this->super_torrent_hot_members);
      if (bVar1) {
        ppVar5 = ::std::
                 unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ::operator->(&(this->super_torrent_hot_members).m_picker);
        bVar1 = piece_picker::is_downloading(ppVar5,index);
        if (bVar1) {
          ppVar5 = ::std::
                   unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                   ::operator->(&(this->super_torrent_hot_members).m_picker);
          bVar1 = piece_picker::is_piece_finished(ppVar5,index);
          if (bVar1) {
            ppVar5 = ::std::
                     unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                     ::operator->(&(this->super_torrent_hot_members).m_picker);
            bVar1 = piece_picker::is_hashing(ppVar5,index);
            if (!bVar1) {
              piece_passed(this,index);
            }
          }
        }
      }
      __gnu_cxx::
      __normal_iterator<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
      ::operator++(&__end2_1);
    }
    hashes_local.m_len._7_1_ = local_68[0] & 1;
LAB_0068bf97:
    local_b0 = 1;
    add_hashes_result::~add_hashes_result((add_hashes_result *)local_68);
  }
  else {
    hashes_local.m_len._7_1_ = 1;
  }
  return (bool)(hashes_local.m_len._7_1_ & 1);
}

Assistant:

bool torrent::add_hashes(hash_request const& req, span<sha256_hash> hashes)
	{
		need_hash_picker();
		if (!m_hash_picker) return true;
		add_hashes_result const result = m_hash_picker->add_hashes(req, hashes);
		for (auto& p : result.hash_failed)
		{
			if (torrent_file().info_hashes().has_v1() && have_piece(p.first))
			{
				handle_inconsistent_hashes(p.first);
				return result.valid;
			}

			TORRENT_ASSERT(!have_piece(p.first));

			// the piece may not have been downloaded in this session
			// it should be open for downloading so nothing needs to be done here
			if (!m_picker || !m_picker->is_downloading(p.first)) continue;
			piece_failed(p.first, p.second);
		}
		for (piece_index_t p : result.hash_passed)
		{
			if (torrent_file().info_hashes().has_v1() && !have_piece(p))
			{
				handle_inconsistent_hashes(p);
				return result.valid;
			}

			if (m_picker && m_picker->is_downloading(p) && m_picker->is_piece_finished(p)
				&& !m_picker->is_hashing(p))
			{
				piece_passed(p);
			}
		}
		return result.valid;
	}